

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

ExprP<tcu::Vector<float,_2>_> __thiscall
vkt::shaderexecutor::Functions::getComponent<tcu::Matrix<float,2,2>>
          (Functions *this,ExprP<tcu::Matrix<float,_2,_2>_> *container,int ndx)

{
  ExprP<vkt::shaderexecutor::Void> *arg2;
  ExprP<vkt::shaderexecutor::Void> *arg3;
  SharedPtrStateBase *extraout_RDX;
  ExprP<tcu::Vector<float,_2>_> EVar1;
  ExprP<int> local_30;
  int local_1c;
  ExprP<tcu::Matrix<float,_2,_2>_> *pEStack_18;
  int ndx_local;
  ExprP<tcu::Matrix<float,_2,_2>_> *container_local;
  
  local_1c = ndx;
  pEStack_18 = container;
  container_local = (ExprP<tcu::Matrix<float,_2,_2>_> *)this;
  constant<int>((shaderexecutor *)&local_30,&local_1c);
  arg2 = voidP();
  arg3 = voidP();
  app<vkt::shaderexecutor::Functions::GetComponent<tcu::Matrix<float,2,2>>>
            ((shaderexecutor *)this,container,&local_30,arg2,arg3);
  ExprP<int>::~ExprP(&local_30);
  EVar1.super_ContainerExprPBase<tcu::Vector<float,_2>_>.super_ExprPBase<tcu::Vector<float,_2>_>.
  super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_2>_>_>.m_state = extraout_RDX;
  EVar1.super_ContainerExprPBase<tcu::Vector<float,_2>_>.super_ExprPBase<tcu::Vector<float,_2>_>.
  super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_2>_>_>.m_ptr =
       (Expr<tcu::Vector<float,_2>_> *)this;
  return (ExprP<tcu::Vector<float,_2>_>)
         EVar1.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
         super_ExprPBase<tcu::Vector<float,_2>_>.
         super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_2>_>_>;
}

Assistant:

ExprP<typename T::Element> getComponent (const ExprP<T>& container, int ndx)
{
	DE_ASSERT(0 <= ndx && ndx < T::SIZE);
	return app<GetComponent<T> >(container, constant(ndx));
}